

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

geo_argument GEO::hashit(string *inString)

{
  bool bVar1;
  geo_argument gVar2;
  
  bVar1 = std::operator==(inString,"Point");
  if (bVar1) {
    gVar2 = ePoint;
  }
  else {
    bVar1 = std::operator==(inString,"cl__1");
    if (bVar1) {
      gVar2 = eChar_Len;
    }
    else {
      bVar1 = std::operator==(inString,"Line");
      if (bVar1) {
        gVar2 = eLine;
      }
      else {
        bVar1 = std::operator==(inString,"Line Loop");
        gVar2 = eCurve_Loop;
        if ((!bVar1) && (bVar1 = std::operator==(inString,"Curve Loop"), !bVar1)) {
          bVar1 = std::operator==(inString,"Plane Surface");
          gVar2 = ePlane_surface;
          if ((!bVar1) && (bVar1 = std::operator==(inString,"Surface"), !bVar1)) {
            bVar1 = std::operator==(inString,"Surface Loop");
            if (bVar1) {
              gVar2 = eSurface_loop;
            }
            else {
              bVar1 = std::operator==(inString,"Volume");
              if (bVar1) {
                gVar2 = eVolume;
              }
              else {
                bVar1 = std::operator==(inString,"Physical Point");
                if (bVar1) {
                  gVar2 = ePhysical_Point;
                }
                else {
                  bVar1 = std::operator==(inString,"Physical Line");
                  gVar2 = ePhysical_Curve;
                  if ((!bVar1) && (bVar1 = std::operator==(inString,"Physical Curve"), !bVar1)) {
                    bVar1 = std::operator==(inString,"Physical Surface");
                    if (bVar1) {
                      gVar2 = ePhysical_Surface;
                    }
                    else {
                      bVar1 = std::operator==(inString,"Physical Volume");
                      if (bVar1) {
                        gVar2 = ePhysical_Volume;
                      }
                      else {
                        bVar1 = std::operator==(inString,"MeshSpac");
                        if (bVar1) {
                          gVar2 = eMesh_Spacing;
                        }
                        else {
                          bVar1 = std::operator==(inString,"SetFactory");
                          if (bVar1) {
                            gVar2 = eOpenCASCADE;
                          }
                          else {
                            bVar1 = std::operator==(inString,"");
                            gVar2 = (uint)!bVar1 + (uint)!bVar1 * 2;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return gVar2;
}

Assistant:

GEO::geo_argument GEO::hashit(std::string const& inString)
{
    if (inString == "Point")            return GEO::ePoint;
    if (inString == "cl__1")            return GEO::eChar_Len;
    if (inString == "Line")             return GEO::eLine;
    if (inString == "Line Loop")        return GEO::eCurve_Loop;
    if (inString == "Curve Loop")       return GEO::eCurve_Loop;
    if (inString == "Plane Surface")    return GEO::ePlane_surface;
    if (inString == "Surface")          return GEO::ePlane_surface;
    if (inString == "Surface Loop")     return GEO::eSurface_loop;
    if (inString == "Volume")           return GEO::eVolume;
    if (inString == "Physical Point")   return GEO::ePhysical_Point;
    if (inString == "Physical Line")    return GEO::ePhysical_Curve;
    if (inString == "Physical Curve")   return GEO::ePhysical_Curve;
    if (inString == "Physical Surface") return GEO::ePhysical_Surface;
    if (inString == "Physical Volume")  return GEO::ePhysical_Volume;
    if (inString == "MeshSpac")         return GEO::eMesh_Spacing;
    if (inString == "SetFactory")       return GEO::eOpenCASCADE;
    if (inString == "")                 return GEO::eBlank_Space;
    return GEO::eDefault;
}